

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

ChanopenResult *
chan_open_auth_agent(ChanopenResult *__return_storage_ptr__,ssh2_connection_state *s,SshChannel *sc)

{
  _Bool _Var1;
  char *pcVar2;
  Channel *pCVar3;
  Socket *s_00;
  ChanopenResult *toret;
  Socket *skt;
  Channel *ch;
  Plug *plug;
  SshChannel *sc_local;
  ssh2_connection_state *s_local;
  
  plug = (Plug *)sc;
  sc_local = (SshChannel *)s;
  _Var1 = ssh_agent_forwarding_permitted(&s->cl);
  if (_Var1) {
    pCVar3 = portfwd_raw_new((ConnectionLayer *)&sc_local[0xd].cl,(Plug **)&ch,true);
    s_00 = agent_connect((Plug *)ch);
    pcVar2 = sk_socket_error(s_00);
    if (pcVar2 == (char *)0x0) {
      portfwd_raw_setup(pCVar3,s_00,(SshChannel *)plug);
      __return_storage_ptr__->outcome = CHANOPEN_RESULT_SUCCESS;
      (__return_storage_ptr__->u).failure.wire_message = (char *)pCVar3;
    }
    else {
      portfwd_raw_free(pCVar3);
      __return_storage_ptr__->outcome = CHANOPEN_RESULT_SUCCESS;
      pCVar3 = agentf_new((SshChannel *)plug);
      (__return_storage_ptr__->u).failure.wire_message = (char *)pCVar3;
    }
  }
  else {
    __return_storage_ptr__->outcome = CHANOPEN_RESULT_FAILURE;
    (__return_storage_ptr__->u).failure.reason_code = 1;
    pcVar2 = dupprintf("Agent forwarding is not enabled");
    (__return_storage_ptr__->u).failure.wire_message = pcVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static ChanopenResult chan_open_auth_agent(
    struct ssh2_connection_state *s, SshChannel *sc)
{
    if (!ssh_agent_forwarding_permitted(&s->cl)) {
        CHANOPEN_RETURN_FAILURE(
            SSH2_OPEN_ADMINISTRATIVELY_PROHIBITED,
            ("Agent forwarding is not enabled"));
    }

    /*
     * If possible, make a stream-oriented connection to the agent and
     * set up an ordinary port-forwarding type channel over it.
     */
    Plug *plug;
    Channel *ch = portfwd_raw_new(&s->cl, &plug, true);
    Socket *skt = agent_connect(plug);

    if (!sk_socket_error(skt)) {
        portfwd_raw_setup(ch, skt, sc);
        CHANOPEN_RETURN_SUCCESS(ch);
    } else {
        portfwd_raw_free(ch);
        /*
         * Otherwise, fall back to the old-fashioned system of parsing the
         * forwarded data stream ourselves for message boundaries, and
         * passing each individual message to the one-off agent_query().
         */
        CHANOPEN_RETURN_SUCCESS(agentf_new(sc));
    }
}